

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.h
# Opt level: O0

void __thiscall DeviceTy::DeviceTy(DeviceTy *this,DeviceTy *d)

{
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *in_RSI;
  undefined4 *in_RDI;
  map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  *in_stack_ffffffffffffffa8;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *pmVar1;
  map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  *in_stack_ffffffffffffffb0;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *this_00;
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *in_stack_ffffffffffffffe8;
  
  *in_RDI = *(undefined4 *)
             &(in_RSI->super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>).
              _M_impl._M_node.super__List_node_base._M_next;
  *(_List_node_base **)(in_RDI + 2) =
       (in_RSI->super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>)._M_impl.
       _M_node.super__List_node_base._M_prev;
  in_RDI[4] = (int)(in_RSI->
                   super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>).
                   _M_impl._M_node._M_size;
  *(byte *)(in_RDI + 5) =
       *(byte *)((long)&(in_RSI->
                        super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>).
                        _M_impl._M_node._M_size + 4) & 1;
  in_RDI[6] = 0;
  std::once_flag::once_flag((once_flag *)(in_RDI + 6));
  *(byte *)(in_RDI + 7) =
       *(byte *)((long)&in_RSI[1].
                        super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>.
                        _M_impl._M_node.super__List_node_base._M_next + 4) & 1;
  std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::list
            (in_RSI,in_stack_ffffffffffffffe8);
  std::
  map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
  ::map((map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
         *)in_stack_ffffffffffffffb0,
        (map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
         *)in_stack_ffffffffffffffa8);
  std::
  map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  ::map(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pmVar1 = (map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
            *)0x0;
  this_00 = (map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             *)0x0;
  *(undefined8 *)(in_RDI + 0x2a) = 0;
  *(undefined8 *)(in_RDI + 0x2c) = 0;
  *(undefined8 *)(in_RDI + 0x26) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x2e) = 0;
  std::mutex::mutex((mutex *)0x10f1a3);
  *(map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    **)(in_RDI + 0x34) = pmVar1;
  *(map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    **)(in_RDI + 0x36) = this_00;
  *(map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    **)(in_RDI + 0x30) = pmVar1;
  *(map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    **)(in_RDI + 0x32) = this_00;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  std::mutex::mutex((mutex *)0x10f1d4);
  *(map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    **)(in_RDI + 0x3e) = pmVar1;
  *(map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    **)(in_RDI + 0x40) = this_00;
  *(map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    **)(in_RDI + 0x3a) = pmVar1;
  *(map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    **)(in_RDI + 0x3c) = this_00;
  *(undefined8 *)(in_RDI + 0x42) = 0;
  std::mutex::mutex((mutex *)0x10f205);
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  map(this_00,pmVar1);
  *(_List_node_base **)(in_RDI + 0x50) =
       in_RSI[0xd].super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl
       ._M_node.super__List_node_base._M_prev;
  return;
}

Assistant:

DeviceTy(const DeviceTy &d)
      : DeviceID(d.DeviceID), RTL(d.RTL), RTLDeviceID(d.RTLDeviceID),
        IsInit(d.IsInit), InitFlag(), HasPendingGlobals(d.HasPendingGlobals),
        HostDataToTargetMap(d.HostDataToTargetMap),
        PendingCtorsDtors(d.PendingCtorsDtors), ShadowPtrMap(d.ShadowPtrMap),
        DataMapMtx(), PendingGlobalsMtx(),
        ShadowMtx(), LoopTripCnt(d.LoopTripCnt),
        RTLRequiresFlags(d.RTLRequiresFlags) {}